

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

void __thiscall NodeList::add_node(NodeList *this,GridNode *node)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  GridNode **ppGVar4;
  int local_34;
  int local_28;
  int local_24;
  int i_1;
  int i;
  GridNode **tempList;
  GridNode *node_local;
  NodeList *this_local;
  
  this->count = this->count + 1;
  if (this->capacity == this->count + -1) {
    if (this->capacity < 4) {
      local_34 = this->capacity + 1;
    }
    else {
      local_34 = (int)((float)this->capacity * 1.5);
    }
    this->capacity = local_34;
    if (1 < this->count) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(this->count + -1);
      uVar3 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      _i_1 = operator_new__(uVar3);
      for (local_24 = 0; local_24 < this->count + -1; local_24 = local_24 + 1) {
        *(GridNode **)((long)_i_1 + (long)local_24 * 8) = this->list[local_24];
      }
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)this->capacity;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppGVar4 = (GridNode **)operator_new__(uVar3);
    this->list = ppGVar4;
    for (local_28 = 0; local_28 < this->count + -1; local_28 = local_28 + 1) {
      this->list[local_28] = *(GridNode **)((long)_i_1 + (long)local_28 * 8);
    }
  }
  this->list[this->count + -1] = node;
  return;
}

Assistant:

void add_node(GridNode *node)
    {
        count++;
        if (capacity == count - 1)
        {
            capacity = (capacity <= 3) ? (capacity + 1) : ((int)(capacity * 1.5f));
            GridNode **tempList;
            if (count > 1)
            {
                tempList = new GridNode *[count - 1];
                for (int i = 0; i < count - 1; i++)
                {
                    tempList[i] = list[i];
                }
            }
            list = new GridNode *[capacity];
            for (int i = 0; i < count - 1; i++)
            {
                list[i] = tempList[i];
            }
        }
        list[count - 1] = node;
    }